

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::PrimitiveGen
          (DrawIndirectBase *this,GLenum primitiveType,uint drawSizeX,uint drawSizeY,
          CColorArray *output)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  runtime_error *this_00;
  uint i;
  uint i_1;
  uint uVar2;
  uint j;
  uint uVar3;
  Vector<float,_4> local_68;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  switch(primitiveType) {
  case 0:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_54 = 2.0 / (float)*(int *)CONCAT44(extraout_var_01,iVar1);
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_4c = 2.0 / (float)*(int *)(CONCAT44(extraout_var_02,iVar1) + 4);
    local_48 = local_4c * 0.5;
    local_50 = local_54 * 0.5;
    for (uVar2 = 0; uVar2 != drawSizeY; uVar2 = uVar2 + 1) {
      local_58 = (float)uVar2 * local_4c + -1.0 + local_48;
      for (uVar3 = 0; drawSizeX != uVar3; uVar3 = uVar3 + 1) {
        local_68.m_data[1] = local_58;
        local_68.m_data[0] = (float)uVar3 * local_54 + -1.0 + local_50;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
      }
    }
    break;
  case 1:
  case 2:
  case 3:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_54 = 2.0 / (float)*(int *)(CONCAT44(extraout_var,iVar1) + 4);
    local_50 = local_54 * 0.5;
    local_4c = local_54 * 0.0625;
    for (uVar2 = 0; drawSizeY != uVar2; uVar2 = uVar2 + 1) {
      local_58 = (float)uVar2 * local_54 + -1.0 + local_50 + local_4c;
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = -1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
    }
    break;
  case 4:
  case 5:
  case 6:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeX * 0xc));
    if (drawSizeX != 1) {
      if (drawSizeX != 0) {
        local_48 = 2.0 / (float)drawSizeX;
        local_44 = 2.0 / (float)drawSizeY;
        for (uVar2 = 0; uVar2 != drawSizeY; uVar2 = uVar2 + 1) {
          local_54 = (float)uVar2 * local_44 + -1.0;
          local_50 = local_44 + local_54;
          for (uVar3 = 0; drawSizeX != uVar3; uVar3 = uVar3 + 1) {
            local_58 = (float)uVar3 * local_48 + -1.0;
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_58;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_4c = local_48 + local_58;
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_58;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_58;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
          }
        }
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid drawSizeX!");
      goto LAB_00bacc2f;
    }
    local_68.m_data[0] = -1.0;
    local_68.m_data[1] = -1.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    local_68.m_data[0] = 4.0;
    local_68.m_data[1] = -1.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    local_68.m_data[0] = -1.0;
    local_68.m_data[1] = 4.0;
    goto LAB_00bac9a3;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown primitive type!");
LAB_00bacc2f:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 10:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_50 = 2.0 / (float)*(int *)(CONCAT44(extraout_var_03,iVar1) + 4);
    local_4c = local_50 * 0.5;
    local_48 = local_50 * 0.0625;
    for (uVar2 = 0; drawSizeY != uVar2; uVar2 = uVar2 + 1) {
      local_58 = (float)uVar2 * local_50 + -1.0 + local_4c + local_48;
      local_54 = local_58 + -1.0;
      local_68.m_data[1] = local_54;
      local_68.m_data[0] = -1.5;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = -1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_54;
      local_68.m_data[0] = 1.5;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
    }
    break;
  case 0xb:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_54 = 2.0 / (float)*(int *)(CONCAT44(extraout_var_00,iVar1) + 4);
    local_50 = local_54 * 0.5;
    local_68.m_data[1] = local_50;
    local_68.m_data[0] = -1.5;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    local_4c = local_54 * 0.0625;
    for (uVar2 = 0; drawSizeY != uVar2; uVar2 = uVar2 + 1) {
      local_58 = (float)uVar2 * local_54 + -1.0 + local_50 + local_4c;
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = -1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = -1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
      local_68.m_data[1] = local_58;
      local_68.m_data[0] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                 &local_68);
    }
    local_68.m_data[1] = 1.0 - local_50;
    local_68.m_data[0] = 1.5;
LAB_00bac9a3:
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    break;
  case 0xc:
    local_48 = 1.0 / (float)drawSizeX;
    local_3c = 1.0 / (float)drawSizeY;
    local_40 = local_3c + local_3c;
    local_38 = local_48 + local_48;
    for (uVar2 = 0; uVar2 != drawSizeX; uVar2 = uVar2 + 1) {
      local_54 = (float)uVar2 * local_3c + -0.5;
      local_50 = local_3c + local_54;
      local_44 = local_54 - local_3c;
      local_34 = local_40 + local_54;
      for (uVar3 = 0; drawSizeY != uVar3; uVar3 = uVar3 + 1) {
        local_58 = (float)uVar3 * local_48 + -0.5;
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_50;
        local_68.m_data[0] = local_58 - local_48;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_50;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_4c = local_48 + local_58;
        local_68.m_data[1] = local_50;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_44;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_50;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_38 + local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_50;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_34;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
      }
    }
    break;
  case 0xd:
    local_50 = 1.0 / (float)drawSizeX;
    local_3c = 1.0 / (float)drawSizeY;
    local_40 = local_3c + local_3c;
    local_38 = local_50 + local_50;
    for (uVar2 = 0; uVar2 != drawSizeX; uVar2 = uVar2 + 1) {
      local_48 = (float)uVar2 * local_3c + -0.5;
      local_54 = local_3c + local_48;
      local_44 = local_48 - local_3c;
      local_34 = local_40 + local_48;
      for (uVar3 = 0; drawSizeY != uVar3; uVar3 = uVar3 + 1) {
        local_58 = (float)uVar3 * local_50 + -0.5;
        local_68.m_data[1] = local_48;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_58 - local_50;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_4c = local_50 + local_58;
        local_68.m_data[1] = local_44;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_48;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_34;
        local_68.m_data[0] = local_58;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = local_4c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_44;
        local_68.m_data[0] = local_58 + local_38;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
      }
    }
  }
  return;
}

Assistant:

void PrimitiveGen(GLenum primitiveType, unsigned int drawSizeX, unsigned int drawSizeY, CColorArray& output)
	{
		switch (primitiveType)
		{
		case GL_POINTS:
			PointsGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES:
		case GL_LINE_STRIP:
		case GL_LINE_LOOP:
			LinesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES_ADJACENCY:
			LinesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINE_STRIP_ADJACENCY:
			LineStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES:
		case GL_TRIANGLE_STRIP:
		case GL_TRIANGLE_FAN:
			TrianglesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES_ADJACENCY:
			TrianglesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLE_STRIP_ADJACENCY:
			TriangleStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		default:
			throw std::runtime_error("Unknown primitive type!");
			break;
		}
	}